

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O0

void duckdb_je_eset_remove(eset_t *eset,edata_t *edata)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  size_t sz;
  size_t sVar4;
  edata_t *in_RSI;
  eset_t *in_RDI;
  edata_cmp_summary_t eVar5;
  size_t cur_extents_npages;
  size_t npages;
  edata_cmp_summary_t edata_cmp_summary;
  pszind_t pind;
  size_t psz;
  size_t size;
  size_t result;
  pszind_t ind;
  pszind_t base_ind;
  pszind_t rg_inner_off;
  pszind_t lg_delta;
  pszind_t off_to_first_ps_rg;
  pszind_t x;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  byte local_c0;
  int local_bc;
  uint64_t local_a8;
  uintptr_t local_a0;
  uint local_28;
  
  sz = edata_size_get(in_RSI);
  sVar4 = duckdb_je_sz_psz_quantize_floor
                    (CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (sVar4 < 0x7000000000000001) {
    uVar2 = lg_ceil(0x2519b05);
    if (uVar2 < 0xe) {
      local_bc = 0;
    }
    else {
      local_bc = uVar2 - 0xe;
    }
    if (local_bc == 0) {
      local_c0 = 0xc;
    }
    else {
      local_c0 = (char)local_bc + 0xb;
    }
    local_28 = local_bc * 4 + ((uint)(sVar4 - 1 >> (local_c0 & 0x3f)) & 3);
  }
  else {
    local_28 = 199;
  }
  eset_stats_sub(in_RDI,local_28,sz);
  eVar5 = edata_cmp_summary_get((edata_t *)0x2519bee);
  duckdb_je_edata_heap_remove
            ((edata_heap_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (edata_t *)0x2519c1c);
  _Var1 = duckdb_je_edata_heap_empty(&in_RDI->bins[local_28].heap);
  if (_Var1) {
    fb_unset(in_RDI->bitmap,200,(ulong)local_28);
  }
  else {
    iVar3 = edata_cmp_summary_comp(eVar5,in_RDI->bins[local_28].heap_min);
    if (iVar3 == 0) {
      duckdb_je_edata_heap_first
                ((edata_heap_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      eVar5 = edata_cmp_summary_get((edata_t *)0x2519cce);
      local_a8 = eVar5.sn;
      in_RDI->bins[local_28].heap_min.sn = local_a8;
      local_a0 = eVar5.addr;
      in_RDI->bins[local_28].heap_min.addr = local_a0;
    }
  }
  edata_list_inactive_remove(&in_RDI->lru,in_RSI);
  (in_RDI->npages).repr = (in_RDI->npages).repr - (sz >> 0xc);
  return;
}

Assistant:

void
eset_remove(eset_t *eset, edata_t *edata) {
	assert(edata_state_get(edata) == eset->state ||
	    edata_state_in_transition(edata_state_get(edata)));

	size_t size = edata_size_get(edata);
	size_t psz = sz_psz_quantize_floor(size);
	pszind_t pind = sz_psz2ind(psz);
	if (config_stats) {
		eset_stats_sub(eset, pind, size);
	}

	edata_cmp_summary_t edata_cmp_summary = edata_cmp_summary_get(edata);
	edata_heap_remove(&eset->bins[pind].heap, edata);
	if (edata_heap_empty(&eset->bins[pind].heap)) {
		fb_unset(eset->bitmap, ESET_NPSIZES, (size_t)pind);
	} else {
		/*
		 * This is a little weird; we compare if the summaries are
		 * equal, rather than if the edata we removed was the heap
		 * minimum.  The reason why is that getting the heap minimum
		 * can cause a pairing heap merge operation.  We can avoid this
		 * if we only update the min if it's changed, in which case the
		 * summaries of the removed element and the min element should
		 * compare equal.
		 */
		if (edata_cmp_summary_comp(edata_cmp_summary,
		    eset->bins[pind].heap_min) == 0) {
			eset->bins[pind].heap_min = edata_cmp_summary_get(
			    edata_heap_first(&eset->bins[pind].heap));
		}
	}
	edata_list_inactive_remove(&eset->lru, edata);
	size_t npages = size >> LG_PAGE;
	/*
	 * As in eset_insert, we hold eset->mtx and so don't need atomic
	 * operations for updating eset->npages.
	 */
	size_t cur_extents_npages =
	    atomic_load_zu(&eset->npages, ATOMIC_RELAXED);
	assert(cur_extents_npages >= npages);
	atomic_store_zu(&eset->npages,
	    cur_extents_npages - (size >> LG_PAGE), ATOMIC_RELAXED);
}